

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::Simulator::set_i
          (Simulator *this,Var *var,optional<std::vector<long,_std::allocator<long>_>_> *value,
          bool eval_)

{
  pointer *ppuVar1;
  char *__file;
  bool bVar2;
  uint uVar3;
  int iVar4;
  vector<long,_std::allocator<long>_> *__x;
  size_type __n;
  reference plVar5;
  undefined4 extraout_var;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_b0;
  char *local_90;
  uint64_t u_v;
  long v;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  undefined1 local_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> u_vs;
  vector<long,_std::allocator<long>_> vs;
  bool eval__local;
  optional<std::vector<long,_std::allocator<long>_>_> *value_local;
  Var *var_local;
  Simulator *this_local;
  
  bVar2 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar2) {
    __x = std::optional<std::vector<long,_std::allocator<long>_>_>::operator*(value);
    ppuVar1 = &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)ppuVar1,__x);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    __n = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)ppuVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,__n);
    ppuVar1 = &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)ppuVar1);
    v = (long)std::vector<long,_std::allocator<long>_>::end
                        ((vector<long,_std::allocator<long>_> *)ppuVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&v), bVar2) {
      plVar5 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&__end2);
      u_v = *plVar5;
      __file = *(char **)u_v;
      local_90 = __file;
      uVar3 = (*(var->super_IRNode)._vptr_IRNode[7])();
      iVar4 = truncate(__file,(ulong)uVar3);
      local_90 = (char *)CONCAT44(extraout_var,iVar4);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_58,
                 (unsigned_long *)&local_90);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2);
    }
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
              (&local_b0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    set_complex_value_(this,var,&local_b0);
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional(&local_b0)
    ;
    if (eval_) {
      eval(this);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Simulator::set_i(const kratos::Var *var, const std::optional<std::vector<int64_t>> &value,
                      bool eval_) {
    if (value) {
        auto vs = *value;
        std::vector<uint64_t> u_vs;
        u_vs.reserve(vs.size());
        for (auto v : vs) {
            auto u_v = *(reinterpret_cast<uint64_t *>(v));
            u_v = truncate(u_v, var->width());
            u_vs.emplace_back(u_v);
        }
        set_complex_value_(var, u_vs);
        if (eval_) eval();
    }
}